

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_InStateSequence
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  AActor *this;
  char *pcVar3;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      this = (AActor *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (this != (AActor *)0x0) {
          bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
          if (!bVar1) {
            pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_00430939;
          }
        }
LAB_004308d0:
        if (numparam == 1) {
          pcVar3 = "(paramnum) < numparam";
        }
        else {
          if (param[1].field_0.field_3.Type == '\x03') {
            if ((uint)numparam < 3) {
              pcVar3 = "(paramnum) < numparam";
            }
            else {
              if (param[2].field_0.field_3.Type == '\x03') {
                bVar1 = AActor::InStateSequence
                                  (this,(FState *)param[1].field_0.field_1.a,
                                   (FState *)param[2].field_0.field_1.a);
                if (numret < 1) {
                  iVar2 = 0;
                }
                else {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                  ,0x248,
                                  "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  VMReturn::SetInt(ret,(uint)bVar1);
                  iVar2 = 1;
                }
                return iVar2;
              }
              pcVar3 = "param[paramnum].Type == REGT_POINTER";
            }
            __assert_fail(pcVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x247,
                          "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar3 = "param[paramnum].Type == REGT_POINTER";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x246,
                      "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (this == (AActor *)0x0) goto LAB_004308d0;
    }
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00430939:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x245,
                "int AF_AActor_InStateSequence(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, InStateSequence)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER(newstate, FState);
	PARAM_POINTER(basestate, FState);
	ACTION_RETURN_BOOL(self->InStateSequence(newstate, basestate));
}